

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualToTests.cpp
# Opt level: O0

void __thiscall IsEqualToTests::Run(IsEqualToTests *this)

{
  anon_class_1_0_00000001 local_159;
  function<void_()> local_158;
  allocator local_131;
  string local_130 [39];
  anon_class_1_0_00000001 local_109;
  function<void_()> local_108;
  allocator local_e1;
  string local_e0 [39];
  anon_class_1_0_00000001 local_b9;
  function<void_()> local_b8;
  allocator local_91;
  string local_90 [39];
  anon_class_1_0_00000001 local_69;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  IsEqualToTests *local_10;
  IsEqualToTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Is::EqualTo succeeds",&local_31);
  std::function<void()>::function<IsEqualToTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_69);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Is::EqualTo fails",&local_91);
  std::function<void()>::function<IsEqualToTests::Run()::_lambda()_2_,void>
            ((function<void()> *)&local_b8,&local_b9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_90,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Is::EqualTo is an operand",&local_e1);
  std::function<void()>::function<IsEqualToTests::Run()::_lambda()_3_,void>
            ((function<void()> *)&local_108,&local_109);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_e0,&local_108);
  std::function<void_()>::~function(&local_108);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Is::EqualTo has an error message",&local_131);
  std::function<void()>::function<IsEqualToTests::Run()::_lambda()_4_,void>
            ((function<void()> *)&local_158,&local_159);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_130,&local_158);
  std::function<void_()>::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::EqualTo succeeds", []() {
			AssertThat(ut11::Is::EqualTo(7)(7), ut11::Is::True);
		});

		Then("Is::EqualTo fails", []() {
			AssertThat(ut11::Is::EqualTo(7)(15), ut11::Is::Not::True);
		});

		Then("Is::EqualTo is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::EqualTo(7)) >::value, ut11::Is::True);
		});

		Then("Is::EqualTo has an error message", []() {
			AssertThat(ut11::Is::EqualTo(false).GetErrorMessage(true), ut11::Is::Not::EqualTo(""));
		});
	}